

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O3

void __thiscall
picojson::value::_serialize<std::back_insert_iterator<std::__cxx11::string>>
          (value *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          oi,int indent)

{
  array *paVar1;
  object *poVar2;
  _Base_ptr p_Var3;
  int iVar4;
  char cVar5;
  pointer this_00;
  ulong uVar6;
  int iVar7;
  string local_50;
  
  iVar7 = this->type_;
  cVar5 = (char)oi.container;
  if (iVar7 == 5) {
    std::__cxx11::string::push_back(cVar5);
    iVar7 = indent + 1;
    indent = -1;
    if (iVar7 == 0) {
      iVar7 = -1;
    }
    poVar2 = (this->u_).object_;
    p_Var3 = (poVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var3 != &(poVar2->_M_t)._M_impl.super__Rb_tree_header) {
      if (p_Var3 != (poVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        std::__cxx11::string::push_back(cVar5);
      }
      if (iVar7 == -1) {
        serialize_str<std::back_insert_iterator<std::__cxx11::string>>((string *)(p_Var3 + 1),oi);
        iVar4 = -1;
      }
      else {
        _indent<std::back_insert_iterator<std::__cxx11::string>>(oi,iVar7);
        serialize_str<std::back_insert_iterator<std::__cxx11::string>>((string *)(p_Var3 + 1),oi);
        std::__cxx11::string::push_back(cVar5);
        iVar4 = iVar7;
      }
      std::__cxx11::string::push_back(cVar5);
      _serialize<std::back_insert_iterator<std::__cxx11::string>>((value *)(p_Var3 + 2),oi,iVar4);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      poVar2 = (this->u_).object_;
    }
    if ((iVar7 != -1) &&
       (indent = iVar7 + -1, (poVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      _indent<std::back_insert_iterator<std::__cxx11::string>>(oi,indent);
    }
  }
  else {
    if (iVar7 != 4) {
      if (iVar7 == 3) {
        serialize_str<std::back_insert_iterator<std::__cxx11::string>>((this->u_).string_,oi);
      }
      else {
        to_str_abi_cxx11_(&local_50,this);
        if (0 < (long)local_50._M_string_length) {
          uVar6 = local_50._M_string_length + 1;
          do {
            std::__cxx11::string::push_back(cVar5);
            uVar6 = uVar6 - 1;
          } while (1 < uVar6);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0010d4b5;
    }
    std::__cxx11::string::push_back(cVar5);
    iVar7 = indent + 1;
    indent = -1;
    if (iVar7 == 0) {
      iVar7 = -1;
    }
    paVar1 = (this->u_).array_;
    for (this_00 = (paVar1->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        this_00 !=
        (paVar1->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
        super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
      if (this_00 !=
          (paVar1->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::push_back(cVar5);
      }
      if (iVar7 == -1) {
        iVar4 = -1;
      }
      else {
        _indent<std::back_insert_iterator<std::__cxx11::string>>(oi,iVar7);
        iVar4 = iVar7;
      }
      _serialize<std::back_insert_iterator<std::__cxx11::string>>(this_00,oi,iVar4);
      paVar1 = (this->u_).array_;
    }
    if ((iVar7 != -1) &&
       (indent = iVar7 + -1,
       (paVar1->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
       super__Vector_impl_data._M_start != this_00)) {
      _indent<std::back_insert_iterator<std::__cxx11::string>>(oi,indent);
    }
  }
  std::__cxx11::string::push_back(cVar5);
LAB_0010d4b5:
  if (indent == 0) {
    std::__cxx11::string::push_back(cVar5);
  }
  return;
}

Assistant:

void value::_serialize(Iter oi, int indent) const {
  switch (type_) {
  case string_type:
    serialize_str(*u_.string_, oi);
    break;
  case array_type: {
    *oi++ = '[';
    if (indent != -1) {
      ++indent;
    }
    for (array::const_iterator i = u_.array_->begin(); i != u_.array_->end(); ++i) {
      if (i != u_.array_->begin()) {
        *oi++ = ',';
      }
      if (indent != -1) {
        _indent(oi, indent);
      }
      i->_serialize(oi, indent);
    }
    if (indent != -1) {
      --indent;
      if (!u_.array_->empty()) {
        _indent(oi, indent);
      }
    }
    *oi++ = ']';
    break;
  }
  case object_type: {
    *oi++ = '{';
    if (indent != -1) {
      ++indent;
    }
    for (object::const_iterator i = u_.object_->begin(); i != u_.object_->end(); ++i) {
      if (i != u_.object_->begin()) {
        *oi++ = ',';
      }
      if (indent != -1) {
        _indent(oi, indent);
      }
      serialize_str(i->first, oi);
      *oi++ = ':';
      if (indent != -1) {
        *oi++ = ' ';
      }
      i->second._serialize(oi, indent);
    }
    if (indent != -1) {
      --indent;
      if (!u_.object_->empty()) {
        _indent(oi, indent);
      }
    }
    *oi++ = '}';
    break;
  }
  default:
    copy(to_str(), oi);
    break;
  }
  if (indent == 0) {
    *oi++ = '\n';
  }
}